

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params *params,U64 pledgedSrcSize,size_t loadedDictSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  undefined4 uVar1;
  undefined4 uVar4;
  undefined4 uVar5;
  ZSTD_allocFunction p_Var2;
  ZSTD_freeFunction p_Var3;
  undefined4 uVar6;
  undefined4 uVar7;
  ldmParams_t params_00;
  ZSTD_window_t w;
  ZSTD_compressionParameters cParams;
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t code;
  size_t sVar17;
  size_t sVar18;
  ZSTD_compressedBlockState_t *pZVar19;
  U32 *pUVar20;
  seqDef *psVar21;
  long lVar22;
  ldmEntry_t *plVar23;
  rawSeq *prVar24;
  ZSTD_Sequence *pZVar25;
  BYTE *pBVar26;
  size_t __n;
  ldmParams_t *in_RCX;
  ZSTD_compressionParameters *in_RDX;
  void *in_RSI;
  ZSTD_CCtx *in_RDI;
  int in_R8D;
  ZSTD_buffered_policy_e in_R9D;
  size_t unaff_retaddr;
  size_t numBuckets;
  size_t maxNbExternalSeq;
  size_t ldmHSize;
  size_t err_code_2;
  size_t err_code_1;
  int workspaceWasteful;
  int workspaceTooSmall;
  size_t err_code;
  int resizeWorkspace;
  size_t neededSpace;
  ZSTD_indexResetPolicy_e needsIndexReset;
  int dictTooBig;
  int indexTooClose;
  size_t maxNbLdmSeq;
  size_t buffInSize;
  size_t buffOutSize;
  size_t maxNbSeq;
  size_t blockSize;
  size_t windowSize;
  ZSTD_cwksp *ws;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  ZSTD_compressionParameters *pZVar31;
  void *bytes;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  ZSTD_cwksp *ws_00;
  ZSTD_cwksp *in_stack_fffffffffffffee0;
  ZSTD_strategy in_stack_fffffffffffffee8;
  bool local_112;
  size_t sVar32;
  size_t sVar33;
  ZSTD_compressionParameters *blockSize_00;
  ZSTD_compressionParameters *pZVar34;
  ZSTD_compressionParameters *local_f8;
  ZSTD_compressionParameters *local_f0;
  ZSTD_indexResetPolicy_e forceResetIndex;
  undefined8 in_stack_ffffffffffffff20;
  ZSTD_compressionParameters *in_stack_ffffffffffffff28;
  ZSTD_cwksp *in_stack_ffffffffffffff30;
  ZSTD_matchState_t *in_stack_ffffffffffffff38;
  ZSTD_resetTarget_e forWho;
  undefined4 in_stack_ffffffffffffffc4;
  ZSTD_cwksp *ws_01;
  ZSTD_CCtx *cctx;
  int in_stack_fffffffffffffff8;
  
  ws_01 = &in_RDI->workspace;
  pZVar31 = *(ZSTD_compressionParameters **)((long)in_RSI + 0x14);
  uVar6 = *(undefined4 *)((long)in_RSI + 0x1c);
  cParams.chainLog = in_stack_fffffffffffffed4;
  cParams.windowLog = uVar6;
  cParams._8_8_ = in_stack_fffffffffffffed8;
  cParams._16_8_ = in_stack_fffffffffffffee0;
  cParams.strategy = in_stack_fffffffffffffee8;
  uVar28 = uVar6;
  ZSTD_checkCParams(cParams);
  uVar11 = ZSTD_isError(0x3271f8);
  if (uVar11 != 0) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58bf,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  in_RDI->isFirstBlock = 1;
  memcpy(&in_RDI->appliedParams,in_RSI,0xd0);
  if ((in_RDI->appliedParams).useRowMatchFinder == ZSTD_ps_auto) {
    __assert_fail("params->useRowMatchFinder != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58c9,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  if ((in_RDI->appliedParams).useBlockSplitter == ZSTD_ps_auto) {
    __assert_fail("params->useBlockSplitter != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58ca,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  if ((in_RDI->appliedParams).ldmParams.enableLdm == ZSTD_ps_auto) {
    __assert_fail("params->ldmParams.enableLdm != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58cb,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  if ((in_RDI->appliedParams).maxBlockSize == 0) {
    __assert_fail("params->maxBlockSize != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58cc,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  cctx = in_RDI;
  if ((in_RDI->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    ZSTD_ldm_adjustParameters((ldmParams_t *)CONCAT44(in_stack_fffffffffffffed4,uVar6),pZVar31);
    if ((in_RDI->appliedParams).ldmParams.hashLog < (in_RDI->appliedParams).ldmParams.bucketSizeLog)
    {
      __assert_fail("params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x58d0,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    if (0x1f < (in_RDI->appliedParams).ldmParams.hashRateLog) {
      __assert_fail("params->ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x58d1,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
  }
  pZVar31 = in_RDX;
  if ((ZSTD_compressionParameters *)(1L << ((byte)(in_RDI->appliedParams).cParams.windowLog & 0x3f))
      < in_RDX) {
    pZVar31 = (ZSTD_compressionParameters *)
              (1L << ((byte)(in_RDI->appliedParams).cParams.windowLog & 0x3f));
  }
  if (pZVar31 == (ZSTD_compressionParameters *)0x0) {
    local_f0 = (ZSTD_compressionParameters *)0x1;
  }
  else {
    local_f8 = in_RDX;
    if ((ZSTD_compressionParameters *)
        (1L << ((byte)(in_RDI->appliedParams).cParams.windowLog & 0x3f)) < in_RDX) {
      local_f8 = (ZSTD_compressionParameters *)
                 (1L << ((byte)(in_RDI->appliedParams).cParams.windowLog & 0x3f));
    }
    local_f0 = local_f8;
  }
  blockSize_00 = local_f0;
  if ((ZSTD_compressionParameters *)(in_RDI->appliedParams).maxBlockSize < local_f0) {
    blockSize_00 = (ZSTD_compressionParameters *)(in_RDI->appliedParams).maxBlockSize;
  }
  pZVar34 = blockSize_00;
  sVar14 = ZSTD_maxNbSeq((size_t)blockSize_00,(in_RDI->appliedParams).cParams.minMatch,
                         (in_RDI->appliedParams).useSequenceProducer);
  forceResetIndex = (ZSTD_indexResetPolicy_e)((ulong)pZVar31 >> 0x20);
  if ((in_R9D == ZSTDb_buffered) && ((in_RDI->appliedParams).outBufferMode == ZSTD_bm_buffered)) {
    sVar15 = ZSTD_compressBound((size_t)blockSize_00);
    sVar15 = sVar15 + 1;
  }
  else {
    sVar15 = 0;
  }
  if ((in_R9D == ZSTDb_buffered) && ((in_RDI->appliedParams).inBufferMode == ZSTD_bm_buffered)) {
    sVar32 = (long)&blockSize_00->windowLog + (long)&local_f0->windowLog;
  }
  else {
    sVar32 = 0;
  }
  uVar4 = (in_RDI->appliedParams).ldmParams.minMatchLength;
  uVar8 = (in_RDI->appliedParams).ldmParams.enableLdm;
  uVar9 = (in_RDI->appliedParams).ldmParams.hashLog;
  uVar10 = (in_RDI->appliedParams).ldmParams.bucketSizeLog;
  params_00.bucketSizeLog = uVar10;
  params_00.hashLog = uVar9;
  params_00.enableLdm = uVar8;
  uVar1 = (in_RDI->appliedParams).ldmParams.hashRateLog;
  uVar5 = (in_RDI->appliedParams).ldmParams.windowLog;
  params_00.windowLog = uVar5;
  params_00.hashRateLog = uVar1;
  params_00.minMatchLength = uVar4;
  sVar18 = sVar32;
  sVar33 = sVar15;
  sVar16 = ZSTD_ldm_getMaxNbSeq(params_00,(size_t)blockSize_00);
  ws_00 = *(ZSTD_cwksp **)&(cctx->blockState).matchState.window.nbOverflowCorrections;
  uVar6 = (cctx->blockState).matchState.window.dictLimit;
  uVar7 = (cctx->blockState).matchState.window.lowLimit;
  uVar30 = (undefined4)((ulong)(cctx->blockState).matchState.window.base >> 0x20);
  w.base._4_4_ = uVar30;
  w._0_12_ = *(undefined1 (*) [12])&(cctx->blockState).matchState.window;
  w.dictBase = (cctx->blockState).matchState.window.dictBase;
  w.dictLimit = uVar6;
  w.lowLimit = uVar7;
  w._32_8_ = ws_00;
  ZSTD_indexTooCloseToMax(w);
  ZSTD_dictTooBig((size_t)in_RCX);
  iVar13 = (in_RDI->appliedParams).useSequenceProducer;
  bytes = (void *)(in_RDI->appliedParams).maxBlockSize;
  uVar27 = SUB84(in_RDX,0);
  uVar29 = (undefined4)((ulong)in_RDX >> 0x20);
  code = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                   (in_RDX,in_RCX,in_R8D,in_R9D,(size_t)ws_01,
                    CONCAT44(in_stack_ffffffffffffffc4,uVar28),(U64)cctx,in_stack_fffffffffffffff8,
                    unaff_retaddr);
  sVar17 = code;
  uVar11 = ERR_isError(code);
  if (uVar11 != 0) {
    return sVar17;
  }
  if (cctx->staticSize == 0) {
    ZSTD_cwksp_bump_oversized_duration
              ((ZSTD_cwksp *)CONCAT44(uVar30,iVar13),CONCAT44(uVar29,uVar27));
  }
  forWho = (ZSTD_resetTarget_e)sVar17;
  sVar17 = ZSTD_cwksp_sizeof(ws_01);
  iVar12 = ZSTD_cwksp_check_wasteful((ZSTD_cwksp *)CONCAT44(uVar30,iVar13),CONCAT44(uVar29,uVar27));
  local_112 = sVar17 < code || iVar12 != 0;
  if (local_112) {
    if (cctx->staticSize != 0) {
      return 0xffffffffffffffc0;
    }
    customMem.customFree = (ZSTD_freeFunction)sVar33;
    customMem.customAlloc = (ZSTD_allocFunction)sVar18;
    customMem.opaque = pZVar34;
    ZSTD_cwksp_free(in_stack_fffffffffffffee0,customMem);
    p_Var2 = (cctx->customMem).customAlloc;
    uVar27 = SUB84(p_Var2,0);
    uVar29 = (undefined4)((ulong)p_Var2 >> 0x20);
    p_Var3 = (cctx->customMem).customFree;
    iVar13 = (int)p_Var3;
    uVar30 = (undefined4)((ulong)p_Var3 >> 0x20);
    bytes = (cctx->customMem).opaque;
    customMem_00.customFree = (ZSTD_freeFunction)sVar33;
    customMem_00.customAlloc = (ZSTD_allocFunction)sVar18;
    customMem_00.opaque = pZVar34;
    sVar18 = ZSTD_cwksp_create(ws_00,CONCAT44(uVar7,uVar6),customMem_00);
    uVar11 = ERR_isError(sVar18);
    if (uVar11 != 0) {
      return sVar18;
    }
    iVar12 = ZSTD_cwksp_check_available
                       ((ZSTD_cwksp *)CONCAT44(uVar30,iVar13),CONCAT44(uVar29,uVar27));
    if (iVar12 == 0) {
      __assert_fail("ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t))",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5905,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    pZVar19 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws_00,CONCAT44(uVar7,uVar6));
    (cctx->blockState).prevCBlock = pZVar19;
    if ((cctx->blockState).prevCBlock == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pZVar19 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws_00,CONCAT44(uVar7,uVar6));
    (cctx->blockState).nextCBlock = pZVar19;
    if ((cctx->blockState).nextCBlock == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pUVar20 = (U32 *)ZSTD_cwksp_reserve_object(ws_00,CONCAT44(uVar7,uVar6));
    cctx->entropyWorkspace = pUVar20;
    if (cctx->entropyWorkspace == (U32 *)0x0) {
      return 0xffffffffffffffc0;
    }
  }
  ZSTD_cwksp_clear((ZSTD_cwksp *)0x3279bd);
  uVar11 = (in_RDI->appliedParams).cParams.chainLog;
  (cctx->blockState).matchState.cParams.windowLog = (in_RDI->appliedParams).cParams.windowLog;
  (cctx->blockState).matchState.cParams.chainLog = uVar11;
  uVar11 = (in_RDI->appliedParams).cParams.searchLog;
  (cctx->blockState).matchState.cParams.hashLog = (in_RDI->appliedParams).cParams.hashLog;
  (cctx->blockState).matchState.cParams.searchLog = uVar11;
  uVar11 = (in_RDI->appliedParams).cParams.targetLength;
  (cctx->blockState).matchState.cParams.minMatch = (in_RDI->appliedParams).cParams.minMatch;
  (cctx->blockState).matchState.cParams.targetLength = uVar11;
  (cctx->blockState).matchState.cParams.strategy = (in_RDI->appliedParams).cParams.strategy;
  (cctx->blockState).matchState.prefetchCDictTables =
       (uint)((in_RDI->appliedParams).prefetchCDictTables == ZSTD_ps_enable);
  cctx->pledgedSrcSizePlusOne = (unsigned_long_long)((long)&in_RDX->windowLog + 1);
  cctx->consumedSrcSize = 0;
  cctx->producedCSize = 0;
  if (in_RDX == (ZSTD_compressionParameters *)0xffffffffffffffff) {
    (cctx->appliedParams).fParams.contentSizeFlag = 0;
  }
  cctx->blockSize = (size_t)blockSize_00;
  XXH_INLINE_XXH64_reset
            ((XXH_NAMESPACEXXH64_state_t *)CONCAT44(uVar30,iVar13),CONCAT44(uVar29,uVar27));
  cctx->stage = ZSTDcs_init;
  cctx->dictID = 0;
  cctx->dictContentSize = 0;
  ZSTD_reset_compressedBlockState((cctx->blockState).prevCBlock);
  uVar28 = 1;
  sVar18 = ZSTD_reset_matchState
                     (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                      (ZSTD_paramSwitch_e)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                      (ZSTD_compResetPolicy_e)in_stack_ffffffffffffff20,forceResetIndex,forWho);
  uVar11 = ERR_isError(sVar18);
  if (uVar11 == 0) {
    psVar21 = (seqDef *)
              ZSTD_cwksp_reserve_aligned((ZSTD_cwksp *)CONCAT44(uVar7,uVar6),(size_t)bytes);
    (cctx->seqStore).sequencesStart = psVar21;
    if ((in_RDI->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
      lVar22 = 1L << ((byte)(in_RDI->appliedParams).ldmParams.hashLog & 0x3f);
      plVar23 = (ldmEntry_t *)
                ZSTD_cwksp_reserve_aligned((ZSTD_cwksp *)CONCAT44(uVar7,uVar6),(size_t)bytes);
      (cctx->ldmState).hashTable = plVar23;
      memset((cctx->ldmState).hashTable,0,lVar22 << 3);
      prVar24 = (rawSeq *)
                ZSTD_cwksp_reserve_aligned((ZSTD_cwksp *)CONCAT44(uVar7,uVar6),(size_t)bytes);
      cctx->ldmSequences = prVar24;
      cctx->maxNbLdmSequences = sVar16;
      ZSTD_window_init((ZSTD_window_t *)0x327c63);
      (cctx->ldmState).loadedDictEnd = 0;
    }
    if ((in_RDI->appliedParams).useSequenceProducer != 0) {
      sVar18 = ZSTD_sequenceBound((size_t)blockSize_00);
      (cctx->externalMatchCtx).seqBufferCapacity = sVar18;
      pZVar25 = (ZSTD_Sequence *)
                ZSTD_cwksp_reserve_aligned((ZSTD_cwksp *)CONCAT44(uVar7,uVar6),(size_t)bytes);
      (cctx->externalMatchCtx).seqBuffer = pZVar25;
    }
    pBVar26 = ZSTD_cwksp_reserve_buffer
                        ((ZSTD_cwksp *)CONCAT44(uVar30,iVar13),CONCAT44(uVar29,uVar28));
    (cctx->seqStore).litStart = pBVar26;
    (cctx->seqStore).maxNbLit = (size_t)blockSize_00;
    cctx->bufferedPolicy = in_R9D;
    cctx->inBuffSize = sVar32;
    pBVar26 = ZSTD_cwksp_reserve_buffer
                        ((ZSTD_cwksp *)CONCAT44(uVar30,iVar13),CONCAT44(uVar29,uVar28));
    cctx->inBuff = (char *)pBVar26;
    cctx->outBuffSize = sVar15;
    pBVar26 = ZSTD_cwksp_reserve_buffer
                        ((ZSTD_cwksp *)CONCAT44(uVar30,iVar13),CONCAT44(uVar29,uVar28));
    cctx->outBuff = (char *)pBVar26;
    if ((in_RDI->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
      __n = 1L << ((char)(in_RDI->appliedParams).ldmParams.hashLog -
                   (char)(in_RDI->appliedParams).ldmParams.bucketSizeLog & 0x3fU);
      pBVar26 = ZSTD_cwksp_reserve_buffer
                          ((ZSTD_cwksp *)CONCAT44(uVar30,iVar13),CONCAT44(uVar29,uVar28));
      (cctx->ldmState).bucketOffsets = pBVar26;
      memset((cctx->ldmState).bucketOffsets,0,__n);
    }
    ZSTD_referenceExternalSequences(cctx,(rawSeq *)0x0,0);
    (cctx->seqStore).maxNbSeq = sVar14;
    pBVar26 = ZSTD_cwksp_reserve_buffer
                        ((ZSTD_cwksp *)CONCAT44(uVar30,iVar13),CONCAT44(uVar29,uVar28));
    (cctx->seqStore).llCode = pBVar26;
    pBVar26 = ZSTD_cwksp_reserve_buffer
                        ((ZSTD_cwksp *)CONCAT44(uVar30,iVar13),CONCAT44(uVar29,uVar28));
    (cctx->seqStore).mlCode = pBVar26;
    pBVar26 = ZSTD_cwksp_reserve_buffer
                        ((ZSTD_cwksp *)CONCAT44(uVar30,iVar13),CONCAT44(uVar29,uVar28));
    (cctx->seqStore).ofCode = pBVar26;
    iVar13 = ZSTD_cwksp_estimated_space_within_bounds
                       ((ZSTD_cwksp *)CONCAT44(uVar7,uVar6),(size_t)bytes);
    if (iVar13 == 0) {
      __assert_fail("ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5963,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    cctx->initialized = 1;
    sVar18 = 0;
  }
  return sVar18;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params const* params,
                                      U64 const pledgedSrcSize,
                                      size_t const loadedDictSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u, useRowMatchFinder=%d useBlockSplitter=%d",
                (U32)pledgedSrcSize, params->cParams.windowLog, (int)params->useRowMatchFinder, (int)params->useBlockSplitter);
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));

    zc->isFirstBlock = 1;

    /* Set applied params early so we can modify them for LDM,
     * and point params at the applied params.
     */
    zc->appliedParams = *params;
    params = &zc->appliedParams;

    assert(params->useRowMatchFinder != ZSTD_ps_auto);
    assert(params->useBlockSplitter != ZSTD_ps_auto);
    assert(params->ldmParams.enableLdm != ZSTD_ps_auto);
    assert(params->maxBlockSize != 0);
    if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&zc->appliedParams.ldmParams, &params->cParams);
        assert(params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog);
        assert(params->ldmParams.hashRateLog < 32);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params->cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(params->maxBlockSize, windowSize);
        size_t const maxNbSeq = ZSTD_maxNbSeq(blockSize, params->cParams.minMatch, params->useSequenceProducer);
        size_t const buffOutSize = (zbuff == ZSTDb_buffered && params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        size_t const buffInSize = (zbuff == ZSTDb_buffered && params->inBufferMode == ZSTD_bm_buffered)
                ? windowSize + blockSize
                : 0;
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize);

        int const indexTooClose = ZSTD_indexTooCloseToMax(zc->blockState.matchState.window);
        int const dictTooBig = ZSTD_dictTooBig(loadedDictSize);
        ZSTD_indexResetPolicy_e needsIndexReset =
            (indexTooClose || dictTooBig || !zc->initialized) ? ZSTDirp_reset : ZSTDirp_continue;

        size_t const neededSpace =
            ZSTD_estimateCCtxSize_usingCCtxParams_internal(
                &params->cParams, &params->ldmParams, zc->staticSize != 0, params->useRowMatchFinder,
                buffInSize, buffOutSize, pledgedSrcSize, params->useSequenceProducer, params->maxBlockSize);
        int resizeWorkspace;

        FORWARD_IF_ERROR(neededSpace, "cctx size estimate failed!");

        if (!zc->staticSize) ZSTD_cwksp_bump_oversized_duration(ws, 0);

        {   /* Check if workspace is large enough, alloc a new one if needed */
            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);
            resizeWorkspace = workspaceTooSmall || workspaceWasteful;
            DEBUGLOG(4, "Need %zu B workspace", neededSpace);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (resizeWorkspace) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem), "");

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, ENTROPY_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->entropyWorkspace == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->blockState.matchState.cParams = params->cParams;
        zc->blockState.matchState.prefetchCDictTables = params->prefetchCDictTables == ZSTD_ps_enable;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        zc->dictContentSize = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
                &zc->blockState.matchState,
                ws,
                &params->cParams,
                params->useRowMatchFinder,
                crp,
                needsIndexReset,
                ZSTD_resetTarget_CCtx), "");

        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        /* ldm hash table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params->ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            ZSTD_memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            zc->ldmState.loadedDictEnd = 0;
        }

        /* reserve space for block-level external sequences */
        if (params->useSequenceProducer) {
            size_t const maxNbExternalSeq = ZSTD_sequenceBound(blockSize);
            zc->externalMatchCtx.seqBufferCapacity = maxNbExternalSeq;
            zc->externalMatchCtx.seqBuffer =
                (ZSTD_Sequence*)ZSTD_cwksp_reserve_aligned(ws, maxNbExternalSeq * sizeof(ZSTD_Sequence));
        }

        /* buffers */

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        zc->bufferedPolicy = zbuff;
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const numBuckets =
                  ((size_t)1) << (params->ldmParams.hashLog -
                                  params->ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, numBuckets);
            ZSTD_memset(zc->ldmState.bucketOffsets, 0, numBuckets);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));

        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));
        assert(ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace));

        zc->initialized = 1;

        return 0;
    }
}